

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O1

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_recv_op_base<std::experimental::net::v1::mutable_buffer>::do_perform
                 (reactor_op *base)

{
  int __fd;
  int __flags;
  int iVar1;
  error_category *peVar2;
  bool bVar3;
  scheduler_operation *psVar4;
  status sVar5;
  int *piVar6;
  size_t sVar7;
  error_category *peVar8;
  status unaff_EBP;
  buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
  bufs;
  msghdr local_88;
  iovec local_48;
  size_t local_38;
  
  local_48.iov_base = base[1].super_operation.func_;
  local_48.iov_len = *(size_t *)&base[1].super_operation.task_result_;
  __fd = *(int *)&base[1].super_operation.next_;
  __flags = base[1].ec_._M_value;
  psVar4 = base[1].super_operation.next_;
  local_38 = local_48.iov_len;
  piVar6 = __errno_location();
  do {
    *piVar6 = 0;
    local_88.msg_control = (void *)0x0;
    local_88.msg_controllen = 0;
    local_88.msg_name = (void *)0x0;
    local_88.msg_namelen = 0;
    local_88._12_4_ = 0;
    local_88.msg_flags = 0;
    local_88._52_4_ = 0;
    local_88.msg_iov = &local_48;
    local_88.msg_iovlen = 1;
    sVar7 = recvmsg(__fd,&local_88,__flags);
    iVar1 = *piVar6;
    peVar8 = (error_category *)::std::_V2::system_category();
    (base->ec_)._M_value = iVar1;
    (base->ec_)._M_cat = peVar8;
    if (-1 < (long)sVar7) {
      (base->ec_)._M_value = 0;
      (base->ec_)._M_cat = peVar8;
    }
    if (sVar7 == 0 && ((ulong)psVar4 & 0x1000000000) != 0) {
      ::std::error_code::operator=(&base->ec_,eof);
LAB_00117a76:
      unaff_EBP = done;
      bVar3 = true;
    }
    else {
      peVar2 = (base->ec_)._M_cat;
      iVar1 = (base->ec_)._M_value;
      if (peVar2 == peVar8 && iVar1 == 4) {
        bVar3 = false;
      }
      else {
        if (peVar2 != peVar8 || iVar1 != 0xb) {
          if ((long)sVar7 < 0) {
            sVar7 = 0;
          }
          else {
            (base->ec_)._M_value = 0;
            (base->ec_)._M_cat = peVar8;
          }
          base->bytes_transferred_ = sVar7;
          goto LAB_00117a76;
        }
        bVar3 = true;
        unaff_EBP = not_done;
      }
    }
    if (bVar3) {
      sVar5 = unaff_EBP & done;
      if ((((unaff_EBP & done) != not_done) &&
          (((ulong)base[1].super_operation.next_ & 0x1000000000) != 0)) &&
         (base->bytes_transferred_ == 0)) {
        sVar5 = done_and_exhausted;
      }
      return sVar5;
    }
  } while( true );
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_recv(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        (o->state_ & socket_ops::stream_oriented) != 0,
        o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }